

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

ssize_t __thiscall
httplib::detail::SocketStream::write(SocketStream *this,int __fd,void *__buf,size_t __n)

{
  uint uVar1;
  int in_stack_0000001c;
  size_t in_stack_00000020;
  void *in_stack_00000028;
  socket_t in_stack_00000034;
  ssize_t local_8;
  
  uVar1 = (*(this->super_Stream)._vptr_Stream[3])();
  if ((uVar1 & 1) == 0) {
    local_8 = -1;
  }
  else {
    local_8 = send_socket(in_stack_00000034,in_stack_00000028,in_stack_00000020,in_stack_0000001c);
  }
  return local_8;
}

Assistant:

inline ssize_t SocketStream::write(const char *ptr, size_t size) {
  if (!is_writable()) { return -1; }

#if defined(_WIN32) && !defined(_WIN64)
  size =
      (std::min)(size, static_cast<size_t>((std::numeric_limits<int>::max)()));
#endif

  return send_socket(sock_, ptr, size, CPPHTTPLIB_SEND_FLAGS);
}